

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

Logger * __thiscall el::Logger::operator=(Logger *this,Logger *logger)

{
  if (logger != this) {
    if (this->m_typedConfigurations != (TypedConfigurations *)0x0) {
      (*(this->m_typedConfigurations->super_ThreadSafe)._vptr_ThreadSafe[4])();
      this->m_typedConfigurations = (TypedConfigurations *)0x0;
    }
    std::__cxx11::string::_M_assign((string *)&this->m_id);
    this->m_typedConfigurations = logger->m_typedConfigurations;
    std::__cxx11::string::_M_assign((string *)&this->m_parentApplicationName);
    this->m_isConfigured = logger->m_isConfigured;
    if (this != logger) {
      (*(this->m_configurations).
        super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
        super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
        .super_ThreadSafe._vptr_ThreadSafe[0xd])(&this->m_configurations);
      (*(this->m_configurations).
        super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
        super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
        .super_ThreadSafe._vptr_ThreadSafe[0xe])(&this->m_configurations,&logger->m_configurations);
    }
    std::__cxx11::string::_M_assign((string *)&(this->m_configurations).m_configurationFile);
    (this->m_configurations).m_isFromFile = (logger->m_configurations).m_isFromFile;
    base::utils::std::
    _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
    ::operator=(&(this->m_unflushedCount)._M_t,&(logger->m_unflushedCount)._M_t);
    this->m_logStreamsReference = logger->m_logStreamsReference;
  }
  return this;
}

Assistant:

Logger& Logger::operator=(const Logger& logger) {
  if (&logger != this) {
    base::utils::safeDelete(m_typedConfigurations);
    m_id = logger.m_id;
    m_typedConfigurations = logger.m_typedConfigurations;
    m_parentApplicationName = logger.m_parentApplicationName;
    m_isConfigured = logger.m_isConfigured;
    m_configurations = logger.m_configurations;
    m_unflushedCount = logger.m_unflushedCount;
    m_logStreamsReference = logger.m_logStreamsReference;
  }
  return *this;
}